

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

Function * __thiscall
dg::llvmdg::legacy::GraphBuilder::buildFunction
          (GraphBuilder *this,Function *llvmFunction,bool recursively)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Block *block_00;
  pointer ppVar4;
  BasicBlock *pBVar5;
  mapped_type *ppBVar6;
  reference ppSVar7;
  const_reference ppBVar8;
  byte in_DL;
  int iVar9;
  long in_RSI;
  Block *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_bool>
  pVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>,_bool>
  pVar11;
  const_succ_iterator cVar12;
  StronglyConnectedComponent *component;
  iterator __end2_2;
  iterator __begin2_2;
  set<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
  *__range2_2;
  set<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
  *componentss;
  TarjanAnalysis<dg::llvmdg::legacy::Block> tarjan;
  Block *succ_block;
  const_succ_iterator succ;
  Block *block;
  BasicBlock *llvmBlock_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  Function *__range2_1;
  Block *tmpBlock_1;
  bool createCallReturn;
  Block *tmpBlock;
  Instruction *llvmInst;
  const_iterator __end3;
  const_iterator __begin3;
  BasicBlock *__range3;
  bool createBlock;
  BasicBlock *llvmBlock;
  const_iterator __end2;
  const_iterator __begin2;
  Function *__range2;
  Block *lastBlock;
  map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
  instToBlockMap;
  Function *function;
  iterator iterator;
  Function *in_stack_fffffffffffffd08;
  value_type in_stack_fffffffffffffd10;
  mapped_type in_stack_fffffffffffffd18;
  Block *in_stack_fffffffffffffd20;
  Block *in_stack_fffffffffffffd28;
  Function *this_00;
  Block *in_stack_fffffffffffffd48;
  Block *this_01;
  _Self in_stack_fffffffffffffd50;
  _Self local_2a8;
  set<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
  *local_2a0;
  set<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
  *local_298;
  TarjanAnalysis<dg::llvmdg::legacy::Block> *in_stack_fffffffffffffd80;
  Block *in_stack_fffffffffffffd98;
  TarjanAnalysis<dg::llvmdg::legacy::Block> *in_stack_fffffffffffffda0;
  _Map_pointer in_stack_fffffffffffffda8;
  Block *in_stack_fffffffffffffdb0;
  Instruction *in_stack_fffffffffffffdb8;
  GraphBuilder *in_stack_fffffffffffffdc0;
  Instruction *local_180;
  int local_178;
  Instruction *local_170;
  int local_168;
  Instruction *local_160;
  int local_158;
  Instruction *local_150;
  mapped_type local_148;
  reference local_140;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_138;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_130;
  long local_128;
  reference local_120;
  Block *local_118;
  _Base_ptr local_110;
  undefined1 local_108;
  reference local_100;
  byte local_f1;
  reference local_f0;
  Block *local_e8;
  reference local_e0;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_d8;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_d0;
  reference local_c8;
  byte local_b9;
  reference local_b8;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_b0;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_a8;
  long local_a0;
  Block *local_98;
  Function *local_60;
  _Base_ptr local_58;
  undefined1 local_50;
  Block *local_48;
  _Base_ptr local_40;
  undefined1 local_38;
  _Self local_30;
  _Self local_28;
  byte local_19;
  long local_18;
  Function *local_8;
  
  local_19 = in_DL & 1;
  if (in_RSI == 0) {
    local_8 = (Function *)0x0;
  }
  else {
    local_18 = in_RSI;
    local_28._M_node =
         (_Base_ptr)
         std::
         map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
         ::find((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                 *)in_stack_fffffffffffffd08,(key_type *)0x21c6c1);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
         ::end((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                *)in_stack_fffffffffffffd08);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (bVar1) {
      local_8 = (Function *)0x0;
    }
    else {
      this_00 = (Function *)
                &(in_RDI->llvmInstructions_).
                 super__Vector_base<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      block_00 = (Block *)operator_new(0x40);
      Function::Function((Function *)in_stack_fffffffffffffd20);
      local_48 = block_00;
      pVar10 = std::
               map<llvm::Function_const*,dg::llvmdg::legacy::Function*,std::less<llvm::Function_const*>,std::allocator<std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>>>
               ::emplace<llvm::Function_const*&,dg::llvmdg::legacy::Function*>
                         ((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                           *)in_stack_fffffffffffffd20,(Function **)in_stack_fffffffffffffd18,
                          (Function **)in_stack_fffffffffffffd10);
      local_58 = (_Base_ptr)pVar10.first._M_node;
      local_50 = pVar10.second;
      local_40 = local_58;
      local_38 = local_50;
      local_28._M_node = local_58;
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                             *)0x21c7a1);
      local_60 = ppVar4->second;
      std::
      map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
      ::map((map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
             *)0x21c7ba);
      local_98 = (Block *)0x0;
      local_a0 = local_18;
      local_a8.NodePtr = (node_pointer)llvm::Function::begin((Function *)in_stack_fffffffffffffd08);
      local_b0.NodePtr = (node_pointer)llvm::Function::end((Function *)in_stack_fffffffffffffd08);
      while (bVar1 = llvm::operator!=(&local_a8,&local_b0), bVar1) {
        local_b8 = llvm::
                   ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                   ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                                *)0x21c82b);
        bVar1 = isReachable((BasicBlock *)in_stack_fffffffffffffd10);
        if (bVar1) {
          local_b9 = 1;
          local_c8 = local_b8;
          local_d0.NodePtr =
               (node_pointer)llvm::BasicBlock::begin((BasicBlock *)in_stack_fffffffffffffd08);
          local_d8.NodePtr =
               (node_pointer)llvm::BasicBlock::end((BasicBlock *)in_stack_fffffffffffffd08);
          while (bVar1 = llvm::operator!=(&local_d0,&local_d8), bVar1) {
            local_e0 = llvm::
                       ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                       ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                                    *)0x21c8b6);
            if ((local_b9 & 1) != 0) {
              in_stack_fffffffffffffd28 = (Block *)operator_new(0x118);
              Block::Block(in_stack_fffffffffffffd20,(BasicBlock *)in_stack_fffffffffffffd18,
                           SUB81((ulong)in_stack_fffffffffffffd10 >> 0x38,0));
              local_f0 = local_b8;
              local_e8 = in_stack_fffffffffffffd28;
              std::
              unordered_map<const_llvm::BasicBlock_*,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>_>
              ::operator[]((unordered_map<const_llvm::BasicBlock_*,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>_>
                            *)in_stack_fffffffffffffd10,(key_type *)in_stack_fffffffffffffd08);
              std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
              ::push_back((vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                           *)in_stack_fffffffffffffd20,(value_type *)in_stack_fffffffffffffd18);
              Function::addBlock(this_00,block_00);
              if ((local_98 != (Block *)0x0) &&
                 (pBVar5 = Block::llvmBlock(local_98), pBVar5 == local_b8)) {
                Block::addSuccessor(in_stack_fffffffffffffd48,in_RDI);
              }
              local_98 = local_e8;
              local_b9 = 0;
            }
            local_f1 = 0;
            if (((local_19 & 1) != 0) &&
               (uVar2 = llvm::Instruction::getOpcode((Instruction *)0x21c9b5), uVar2 == 0x38)) {
              handleCallInstruction
                        (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                         in_stack_fffffffffffffdb0,(bool *)in_stack_fffffffffffffda8,
                         (bool *)in_stack_fffffffffffffda0);
            }
            Block::addInstruction
                      (in_stack_fffffffffffffd18,(Instruction *)in_stack_fffffffffffffd10);
            local_100 = local_e0;
            pVar11 = std::
                     map<llvm::Instruction_const*,dg::llvmdg::legacy::Block*,std::less<llvm::Instruction_const*>,std::allocator<std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>>>
                     ::emplace<llvm::Instruction_const*,dg::llvmdg::legacy::Block*&>
                               ((map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
                                 *)in_stack_fffffffffffffd20,
                                (Instruction **)in_stack_fffffffffffffd18,
                                (Block **)in_stack_fffffffffffffd10);
            local_110 = (_Base_ptr)pVar11.first._M_node;
            local_108 = pVar11.second;
            if ((local_f1 & 1) != 0) {
              in_stack_fffffffffffffd20 = (Block *)operator_new(0x118);
              Block::Block(in_stack_fffffffffffffd20,(BasicBlock *)in_stack_fffffffffffffd18,
                           SUB81((ulong)in_stack_fffffffffffffd10 >> 0x38,0));
              local_120 = local_b8;
              local_118 = in_stack_fffffffffffffd20;
              std::
              unordered_map<const_llvm::BasicBlock_*,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>_>
              ::operator[]((unordered_map<const_llvm::BasicBlock_*,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>_>
                            *)in_stack_fffffffffffffd10,(key_type *)in_stack_fffffffffffffd08);
              std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
              ::push_back((vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                           *)in_stack_fffffffffffffd20,(value_type *)in_stack_fffffffffffffd18);
              Function::addBlock(this_00,block_00);
              Block::addSuccessor(in_stack_fffffffffffffd48,in_RDI);
              local_98 = local_118;
              local_b9 = 1;
            }
            llvm::
            ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
            ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                          *)in_stack_fffffffffffffd10);
          }
        }
        llvm::
        ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
        ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                      *)in_stack_fffffffffffffd10);
      }
      local_128 = local_18;
      local_130.NodePtr = (node_pointer)llvm::Function::begin((Function *)in_stack_fffffffffffffd08)
      ;
      local_138.NodePtr = (node_pointer)llvm::Function::end((Function *)in_stack_fffffffffffffd08);
      while (bVar1 = llvm::operator!=(&local_130,&local_138), bVar1) {
        local_140 = llvm::
                    ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                    ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                                 *)0x21cb80);
        bVar1 = isReachable((BasicBlock *)in_stack_fffffffffffffd10);
        if (bVar1) {
          local_150 = llvm::BasicBlock::back((BasicBlock *)0x21cbab);
          ppBVar6 = std::
                    map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
                    ::operator[]((map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
                                  *)in_stack_fffffffffffffd50._M_node,
                                 (key_type *)in_stack_fffffffffffffd48);
          local_148 = *ppBVar6;
          cVar12 = llvm::succ_begin((BasicBlock *)0x21cbe0);
          local_170 = cVar12.Inst;
          local_168 = cVar12.Idx;
          local_160 = local_170;
          local_158 = local_168;
          while( true ) {
            cVar12 = llvm::succ_end((BasicBlock *)0x21cc1a);
            local_180 = cVar12.Inst;
            local_178 = cVar12.Idx;
            iVar9 = (int)&local_180;
            bVar1 = llvm::
                    iterator_facade_base<llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>,_std::random_access_iterator_tag,_const_llvm::BasicBlock,_int,_const_llvm::BasicBlock_*,_const_llvm::BasicBlock_*>
                    ::operator!=((iterator_facade_base<llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>,_std::random_access_iterator_tag,_const_llvm::BasicBlock,_int,_const_llvm::BasicBlock_*,_const_llvm::BasicBlock_*>
                                  *)in_stack_fffffffffffffd10,
                                 (SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock> *)
                                 in_stack_fffffffffffffd08);
            if (!bVar1) break;
            llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>::operator->
                      ((SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock> *)0x21cc6f);
            llvm::BasicBlock::front((BasicBlock *)0x21cc77);
            std::
            map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
            ::operator[]((map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
                          *)in_stack_fffffffffffffd50._M_node,(key_type *)in_stack_fffffffffffffd48)
            ;
            Block::addSuccessor(in_stack_fffffffffffffd48,in_RDI);
            llvm::
            iterator_facade_base<llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>,_std::random_access_iterator_tag,_const_llvm::BasicBlock,_int,_const_llvm::BasicBlock_*,_const_llvm::BasicBlock_*>
            ::operator++((iterator_facade_base<llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>,_std::random_access_iterator_tag,_const_llvm::BasicBlock,_int,_const_llvm::BasicBlock_*,_const_llvm::BasicBlock_*>
                          *)0x21ccc1);
          }
          iVar3 = successorsNumber((BasicBlock *)in_stack_fffffffffffffd50._M_node);
          if (iVar3 == 0) {
            in_stack_fffffffffffffd18 = local_148;
            Function::exit(local_60,iVar9);
            Block::addSuccessor(in_stack_fffffffffffffd48,in_RDI);
          }
        }
        llvm::
        ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
        ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                      *)in_stack_fffffffffffffd10);
      }
      Function::nodes(in_stack_fffffffffffffd08);
      std::
      set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
      ::size((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
              *)0x21cd31);
      TarjanAnalysis<dg::llvmdg::legacy::Block>::TarjanAnalysis
                ((TarjanAnalysis<dg::llvmdg::legacy::Block> *)block_00,
                 (size_t)in_stack_fffffffffffffd28);
      std::
      set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
      ::~set((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
              *)0x21cd4b);
      Function::entry(local_60);
      TarjanAnalysis<dg::llvmdg::legacy::Block>::compute
                (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      TarjanAnalysis<dg::llvmdg::legacy::Block>::computeCondensation(in_stack_fffffffffffffd80);
      local_2a0 = TarjanAnalysis<dg::llvmdg::legacy::Block>::components
                            ((TarjanAnalysis<dg::llvmdg::legacy::Block> *)&stack0xfffffffffffffda0);
      local_298 = local_2a0;
      local_2a8._M_node =
           (_Base_ptr)
           std::
           set<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
           ::begin((set<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
                    *)in_stack_fffffffffffffd08);
      std::
      set<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
      ::end((set<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
             *)in_stack_fffffffffffffd08);
      while (bVar1 = std::operator!=(&local_2a8,(_Self *)&stack0xfffffffffffffd50), bVar1) {
        ppSVar7 = std::
                  _Rb_tree_const_iterator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>
                  ::operator*((_Rb_tree_const_iterator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>
                               *)0x21cdd1);
        this_01 = (Block *)*ppSVar7;
        iVar9 = (int)local_60;
        bVar1 = isExit((StronglyConnectedComponent *)in_stack_fffffffffffffd18,
                       (Function *)in_stack_fffffffffffffd10);
        if (!bVar1) {
          TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent::successors
                    ((StronglyConnectedComponent *)this_01);
          bVar1 = std::
                  set<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
                  ::empty((set<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
                           *)0x21ce01);
          if (bVar1) {
            TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent::nodes
                      ((StronglyConnectedComponent *)this_01);
            ppBVar8 = std::
                      vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                      ::back((vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                              *)in_stack_fffffffffffffd10);
            in_stack_fffffffffffffd10 = *ppBVar8;
            Function::exit(local_60,iVar9);
            Block::addSuccessor(this_01,in_RDI);
          }
        }
        std::
        _Rb_tree_const_iterator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>
        ::operator++((_Rb_tree_const_iterator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>
                      *)in_stack_fffffffffffffd10);
      }
      local_8 = local_60;
      TarjanAnalysis<dg::llvmdg::legacy::Block>::~TarjanAnalysis
                ((TarjanAnalysis<dg::llvmdg::legacy::Block> *)block_00);
      std::
      map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
      ::~map((map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
              *)0x21ce76);
    }
  }
  return local_8;
}

Assistant:

Function *GraphBuilder::buildFunction(const llvm::Function *llvmFunction,
                                      bool recursively) {
    if (!llvmFunction) {
        return nullptr;
    }
    auto iterator = _functions.find(llvmFunction);
    if (iterator != _functions.end()) {
        return nullptr;
    }
    iterator = _functions.emplace(llvmFunction, new Function()).first;
    Function *function = iterator->second;

    std::map<const llvm::Instruction *, Block *> instToBlockMap;
    Block *lastBlock = nullptr;
    for (const auto &llvmBlock : *llvmFunction) {
        if (!isReachable(&llvmBlock)) {
            continue;
        }

        bool createBlock = true;
        for (const auto &llvmInst : llvmBlock) {
            if (createBlock) {
                auto *tmpBlock = new Block(&llvmBlock);
                _mapping[&llvmBlock].push_back(tmpBlock);
                function->addBlock(tmpBlock);
                if (lastBlock) {
                    if (lastBlock->llvmBlock() == &llvmBlock) {
                        lastBlock->addSuccessor(tmpBlock);
                    }
                }
                lastBlock = tmpBlock;
                createBlock = false;
            }
            bool createCallReturn = false;
            if (recursively &&
                llvmInst.getOpcode() == llvm::Instruction::Call) {
                handleCallInstruction(&llvmInst, lastBlock, createBlock,
                                      createCallReturn);
            }
            lastBlock->addInstruction(&llvmInst);
            instToBlockMap.emplace(&llvmInst, lastBlock);

            if (createCallReturn) {
                auto *tmpBlock = new Block(&llvmBlock, createCallReturn);
                _mapping[&llvmBlock].push_back(tmpBlock);
                function->addBlock(tmpBlock);
                lastBlock->addSuccessor(tmpBlock);
                lastBlock = tmpBlock;
                createBlock = true;
            }
        }
    }

    for (const auto &llvmBlock : *llvmFunction) {
        if (isReachable(&llvmBlock)) {
            auto *block = instToBlockMap[&llvmBlock.back()];
            for (auto succ = llvm::succ_begin(&llvmBlock);
                 succ != llvm::succ_end(&llvmBlock); ++succ) {
                auto *succ_block = instToBlockMap[&succ->front()];
                block->addSuccessor(succ_block);
            }
            if (successorsNumber(&llvmBlock) == 0) {
                block->addSuccessor(function->exit());
            }
        }
    }

    TarjanAnalysis<Block> tarjan(function->nodes().size());
    tarjan.compute(function->entry());
    tarjan.computeCondensation();
    const auto &componentss = tarjan.components();
    for (auto *const component : componentss) {
        if (!isExit(component, function) && component->successors().empty()) {
            component->nodes().back()->addSuccessor(function->exit());
        }
    }

    //    auto components =
    //    tarjan.computeBackWardReachability(function->exit());

    //    for (auto component : components) {
    //        if (component->nodes().size() > 1 ||
    //            component->successors().find(component) !=
    //            component->successors().end()) {
    //            component->nodes().back()->addSuccessor(function->exit());
    //        }
    //    }

    return function;
}